

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O3

int ipc_ep_init_listener(void *arg,nng_url *url,nni_listener *listener)

{
  int iVar1;
  nni_sock *sock;
  
  sock = nni_listener_sock(listener);
  ipc_ep_init((ipc_ep *)arg,sock,ipc_ep_accept_cb);
  *(nni_listener **)((long)arg + 0x48) = listener;
  iVar1 = nng_stream_listener_alloc_url((nng_stream_listener **)((long)arg + 0x40),url);
  if (iVar1 == 0) {
    nni_listener_add_stat(listener,(nni_stat_item *)((long)arg + 0x420));
  }
  return iVar1;
}

Assistant:

static int
ipc_ep_init_listener(void *arg, nng_url *url, nni_listener *listener)
{
	ipc_ep   *ep = arg;
	int       rv;
	nni_sock *sock = nni_listener_sock(listener);

	ipc_ep_init(ep, sock, ipc_ep_accept_cb);
	ep->nlistener = listener;

	if ((rv = nng_stream_listener_alloc_url(&ep->listener, url)) != 0) {
		return (rv);
	}

#ifdef NNG_ENABLE_STATS
	nni_listener_add_stat(listener, &ep->st_rcv_max);
#endif
	return (0);
}